

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O3

DP_RS_Stream
DummyInitReader(CP_Services Svcs,void *CP_Stream,void **ReaderContactInfoPtr,_SstParams *Params,
               attr_list WriterContact,SstStats Stats)

{
  void *pvVar1;
  undefined8 *puVar2;
  CManager p_Var3;
  char *__s;
  SMPI_Comm comm;
  undefined8 uVar4;
  
  pvVar1 = calloc(1,0x30);
  puVar2 = (undefined8 *)calloc(1,0x10);
  p_Var3 = (*Svcs->getCManager)(CP_Stream);
  __s = (char *)malloc(0x40);
  comm = (*Svcs->getMPIComm)(CP_Stream);
  *(void **)((long)pvVar1 + 8) = CP_Stream;
  SMPI_Comm_rank(comm,(int *)((long)pvVar1 + 0x18));
  snprintf(__s,0x40,"Reader Rank %d, test contact",(ulong)*(uint *)((long)pvVar1 + 0x18));
  uVar4 = CMregister_format(p_Var3,DummyReadRequestStructs);
  *(undefined8 *)((long)pvVar1 + 0x10) = uVar4;
  uVar4 = CMregister_format(p_Var3,DummyReadReplyStructs);
  CMregister_handler(uVar4,DummyReadReplyHandler,Svcs);
  *puVar2 = __s;
  puVar2[1] = pvVar1;
  *ReaderContactInfoPtr = puVar2;
  return pvVar1;
}

Assistant:

static DP_RS_Stream DummyInitReader(CP_Services Svcs, void *CP_Stream, void **ReaderContactInfoPtr,
                                    struct _SstParams *Params, attr_list WriterContact,
                                    SstStats Stats)
{
    Dummy_RS_Stream Stream = malloc(sizeof(struct _Dummy_RS_Stream));
    DummyReaderContactInfo Contact = malloc(sizeof(struct _DummyReaderContactInfo));
    CManager cm = Svcs->getCManager(CP_Stream);
    char *DummyContactString = malloc(64);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    memset(Stream, 0, sizeof(*Stream));
    memset(Contact, 0, sizeof(*Contact));

    /*
     * save the CP_stream value of later use
     */
    Stream->CP_Stream = CP_Stream;

    SMPI_Comm_rank(comm, &Stream->Rank);

    snprintf(DummyContactString, 64, "Reader Rank %d, test contact", Stream->Rank);

    /*
     * add a handler for read reply messages
     */
    Stream->ReadRequestFormat = CMregister_format(cm, DummyReadRequestStructs);
    F = CMregister_format(cm, DummyReadReplyStructs);
    CMregister_handler(F, DummyReadReplyHandler, Svcs);

    Contact->ContactString = DummyContactString;
    Contact->RS_Stream = Stream;

    *ReaderContactInfoPtr = Contact;

    return Stream;
}